

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O0

void __thiscall ATeleportFog::PostBeginPlay(ATeleportFog *this)

{
  FState *pFVar1;
  FName local_1c;
  FName local_18;
  FSoundID local_14;
  ATeleportFog *local_10;
  ATeleportFog *this_local;
  
  local_10 = this;
  AActor::PostBeginPlay(&this->super_AActor);
  FSoundID::FSoundID(&local_14,"misc/teleport");
  S_Sound(&this->super_AActor,4,&local_14,1.0,1.0);
  if ((gameinfo.gametype == GAME_Heretic) || (gameinfo.gametype == GAME_Hexen)) {
    FName::FName(&local_18,NAME_Raven);
    pFVar1 = AActor::FindState(&this->super_AActor,&local_18);
    AActor::SetState(&this->super_AActor,pFVar1,false);
  }
  else if (gameinfo.gametype == GAME_Strife) {
    FName::FName(&local_1c,NAME_Strife);
    pFVar1 = AActor::FindState(&this->super_AActor,&local_1c);
    AActor::SetState(&this->super_AActor,pFVar1,false);
  }
  return;
}

Assistant:

void ATeleportFog::PostBeginPlay ()
{
	Super::PostBeginPlay ();
	S_Sound (this, CHAN_BODY, "misc/teleport", 1, ATTN_NORM);
	switch (gameinfo.gametype)
	{
	case GAME_Hexen:
	case GAME_Heretic:
		SetState(FindState(NAME_Raven));
		break;

	case GAME_Strife:
		SetState(FindState(NAME_Strife));
		break;
		
	default:
		break;
	}
}